

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_stack_check(ASMState *as,BCReg topslot,IRIns *irp,RegSet allow,ExitNo exitno)

{
  MCode *pMVar1;
  MCode *p;
  long lVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint rb;
  
  if (irp == (IRIns *)0x0) {
    uVar4 = 2;
  }
  else {
    uVar4 = (uint)(irp->field_1).r;
  }
  uVar5 = 0;
  if (allow != 0) {
    for (; (allow >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  pMVar1 = as->mcp;
  *(ExitNo *)(pMVar1 + -4) =
       ((exitno & 0x1f) * 4 + *(int *)(as->J->exitstubgroup + (exitno >> 5))) - (int)pMVar1;
  pMVar1[-6] = '\x0f';
  pMVar1[-5] = 0x82;
  as->mcp = pMVar1 + -6;
  uVar6 = (ulong)uVar5;
  if (allow == 0) {
    uVar6 = 0;
    pMVar1[-10] = 'H';
    pMVar1[-9] = 0x8b;
    pMVar1[-8] = '\x04';
    pMVar1[-7] = '$';
    as->mcp = pMVar1 + -10;
  }
  else {
    as->modset = as->modset | 1 << ((byte)uVar5 & 0x1f);
  }
  uVar5 = (uint)uVar6;
  rb = uVar5 | 0x80200;
  emit_gri(as,0x838107,rb,topslot << 3);
  pMVar1 = as->mcp;
  if (uVar4 == uVar5 || 0x7f < uVar4) {
    pMVar1[-4] = 0xf8;
    pMVar1[-3] = 0xf1;
    pMVar1[-2] = 0xff;
    pMVar1[-1] = 0xff;
    pMVar1[-5] = (char)uVar6 * '\b' & 0x38U | 0x86;
    pMVar1[-6] = '+';
    bVar3 = (byte)(uVar6 >> 1) & 4 | 0x49;
    lVar2 = -7;
  }
  else {
    pMVar1[-1] = ((byte)uVar4 & 7) + (char)uVar6 * '\b' | 0xc0;
    pMVar1[-2] = '+';
    bVar3 = (byte)(uVar4 >> 3) & 1 | (byte)(uVar6 >> 1) & 4 | 0x48;
    lVar2 = -3;
  }
  pMVar1[lVar2] = bVar3;
  as->mcp = pMVar1 + lVar2;
  emit_rmro(as,XO_MOV,rb,uVar5,0x30);
  emit_rma(as,XO_MOV,rb,as->J[-1].penalty + 0x3a);
  if (allow == 0) {
    pMVar1 = as->mcp;
    pMVar1[-4] = 'H';
    pMVar1[-3] = 0x89;
    pMVar1[-2] = '\x04';
    pMVar1[-1] = '$';
    as->mcp = pMVar1 + -4;
  }
  return;
}

Assistant:

static void asm_stack_check(ASMState *as, BCReg topslot,
			    IRIns *irp, RegSet allow, ExitNo exitno)
{
  /* Try to get an unused temp. register, otherwise spill/restore eax. */
  Reg pbase = irp ? irp->r : RID_BASE;
  Reg r = allow ? rset_pickbot(allow) : RID_EAX;
  emit_jcc(as, CC_B, exitstub_addr(as->J, exitno));
  if (allow == RSET_EMPTY)  /* Restore temp. register. */
    emit_rmro(as, XO_MOV, r|REX_64, RID_ESP, 0);
  else
    ra_modified(as, r);
  emit_gri(as, XG_ARITHi(XOg_CMP), r|REX_GC64, (int32_t)(8*topslot));
  if (ra_hasreg(pbase) && pbase != r)
    emit_rr(as, XO_ARITH(XOg_SUB), r|REX_GC64, pbase);
  else
#if LJ_GC64
    emit_rmro(as, XO_ARITH(XOg_SUB), r|REX_64, RID_DISPATCH,
	      (int32_t)dispofs(as, &J2G(as->J)->jit_base));
#else
    emit_rmro(as, XO_ARITH(XOg_SUB), r, RID_NONE,
	      ptr2addr(&J2G(as->J)->jit_base));
#endif
  emit_rmro(as, XO_MOV, r|REX_GC64, r, offsetof(lua_State, maxstack));
  emit_getgl(as, r, cur_L);
  if (allow == RSET_EMPTY)  /* Spill temp. register. */
    emit_rmro(as, XO_MOVto, r|REX_64, RID_ESP, 0);
}